

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

void Am_Delete_Word_Before_Cursor(Am_Object *text)

{
  bool bVar1;
  Am_Code_Flag AVar2;
  Am_Value *pAVar3;
  char *pcVar4;
  size_t sVar5;
  Am_Object local_68;
  Am_String local_60;
  int local_54;
  char *pcStack_50;
  int start_wrd;
  char *new_str;
  int str_len;
  Am_String old_str;
  int cursor_index;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *text_local;
  
  local_10 = text;
  pAVar3 = Am_Object::Get(text,0xe4,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (bVar1) {
    Am_Object::Am_Object(&local_18,text);
    Am_Delete_Entire_String(&local_18);
    Am_Object::~Am_Object(&local_18);
  }
  else {
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffd0,text);
    AVar2 = ml_which_code((Am_Object *)&stack0xffffffffffffffd0);
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffd0);
    if (AVar2 != Am_TWO_BYTE_CODE) {
      pAVar3 = Am_Object::Get(text,0xad,0);
      old_str.data._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
      pAVar3 = Am_Object::Get(text,0xab,0);
      Am_String::Am_String((Am_String *)&stack0xffffffffffffffc0,pAVar3);
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffc0);
      sVar5 = strlen(pcVar4);
      new_str._4_4_ = (int)sVar5;
      if (old_str.data._4_4_ <= new_str._4_4_) {
        local_54 = old_str.data._4_4_;
        while( true ) {
          bVar1 = false;
          if (0 < local_54) {
            pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffc0);
            bVar1 = pcVar4[local_54 + -1] == ' ';
          }
          if (!bVar1) break;
          local_54 = local_54 + -1;
        }
        while( true ) {
          bVar1 = false;
          if (0 < local_54) {
            pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffc0);
            bVar1 = pcVar4[local_54 + -1] != ' ';
          }
          if (!bVar1) break;
          local_54 = local_54 + -1;
        }
        pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffc0);
        pcStack_50 = Am_Delete_Substring(pcVar4,local_54,old_str.data._4_4_);
        Am_String::Am_String(&local_60,pcStack_50,false);
        Am_Object::Set(text,0xab,&local_60,0);
        Am_String::~Am_String(&local_60);
        Am_Object::Am_Object(&local_68,text);
        Am_Move_Cursor_Left(&local_68,old_str.data._4_4_ - local_54);
        Am_Object::~Am_Object(&local_68);
      }
      Am_String::~Am_String((Am_String *)&stack0xffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void
Am_Delete_Word_Before_Cursor(Am_Object text)
{
  if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
    Am_Delete_Entire_String(text);
  else if (ml_which_code(text) == Am_TWO_BYTE_CODE)
    ;
  // Space does not exist in two-byte code string.
  else { // Am_ONE_BYTE_CODE or Am_SHIFT_JIS_CODE
    int cursor_index = text.Get(Am_CURSOR_INDEX);
    Am_String old_str = text.Get(Am_TEXT);
    int str_len = strlen(old_str);
    if (cursor_index <= str_len) {
      char *new_str;
      int start_wrd = cursor_index;
      // if there are spaces before the cursor, delete them with the word
      while (start_wrd > 0 && ((const char *)old_str)[start_wrd - 1] == ' ') {
        start_wrd--;
      }
      // delete back to but not including the next space
      while (start_wrd > 0 && ((const char *)old_str)[start_wrd - 1] != ' ') {
        start_wrd--;
      }
      // create a new string, since it changed in size.
      // +1 for the terminating /0
      new_str = Am_Delete_Substring(old_str, start_wrd, cursor_index);
      text.Set(Am_TEXT, Am_String(new_str, false));
      Am_Move_Cursor_Left(text, cursor_index - start_wrd);
    }
  }
}